

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

bool __thiscall
SI_GenericNoCase<char>::operator()(SI_GenericNoCase<char> *this,char *pLeft,char *pRight)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char cVar4;
  
  cVar2 = *pLeft;
  if (cVar2 != '\0') {
    pcVar3 = pLeft + 1;
    do {
      cVar1 = *pRight;
      if (cVar1 == '\0') break;
      cVar4 = cVar2 + ' ';
      if ((byte)(cVar2 + 0xa5U) < 0xe6) {
        cVar4 = cVar2;
      }
      cVar2 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar2 = cVar1;
      }
      if (cVar4 != cVar2) {
        return cVar4 < cVar2;
      }
      pRight = pRight + 1;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return *pRight != '\0';
}

Assistant:

bool operator()(const SI_CHAR * pLeft, const SI_CHAR * pRight) const {
        long cmp;
        for ( ;*pLeft && *pRight; ++pLeft, ++pRight) {
            cmp = (long) locase(*pLeft) - (long) locase(*pRight);
            if (cmp != 0) {
                return cmp < 0;
            }
        }
        return *pRight != 0;
    }